

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double eval_guided_crit<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *buffer_arr,
                 size_t *buffer_pos,bool as_relative_gain,double *saved_xmedian,double *split_point,
                 double *xmin,double *xmax,GainCriterion criterion,double min_gain,
                 MissingAction missing_action,size_t *cols_use,size_t ncols_use,bool force_cols_use,
                 double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  undefined1 auVar1 [16];
  size_t *__first;
  MissingAction MVar2;
  MissingAction missing_action_00;
  ulong uVar3;
  ulong *puVar4;
  double *pdVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  double *pdVar10;
  ulong end_00;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  int iVar21;
  size_t ignored;
  
  MVar2 = missing_action;
  pdVar10 = saved_xmedian;
  __first = buffer_pos;
  pdVar5 = buffer_arr;
  todense<double,unsigned_long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar1 = _DAT_0036e1f0;
  end_00 = end - st;
  uVar13 = end_00 + 1;
  if (uVar13 == 0) {
    missing_action_00 = Fail;
    if (MVar2 != Impute) {
      missing_action_00 = MVar2;
    }
  }
  else {
    uVar11 = end_00 & 0x1fffffffffffffff;
    auVar19._8_4_ = (int)uVar11;
    auVar19._0_8_ = uVar11;
    auVar19._12_4_ = (int)(uVar11 >> 0x20);
    sVar6 = 0;
    auVar19 = auVar19 ^ _DAT_0036e1f0;
    auVar18 = _DAT_0036e1e0;
    do {
      auVar17 = auVar18 ^ auVar1;
      iVar20 = auVar19._4_4_;
      iVar21 = auVar19._12_4_;
      if ((bool)(~(auVar17._4_4_ == iVar20 && auVar19._0_4_ < auVar17._0_4_ ||
                  iVar20 < auVar17._4_4_) & 1)) {
        __first[sVar6] = sVar6;
      }
      if ((auVar17._12_4_ != iVar21 || auVar17._8_4_ <= auVar19._8_4_) && auVar17._12_4_ <= iVar21)
      {
        __first[sVar6 + 1] = sVar6 + 1;
      }
      sVar6 = sVar6 + 2;
      lVar12 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar12 + 2;
    } while ((uVar11 - ((uint)end_00 & 1)) + 2 != sVar6);
    missing_action_00 = Fail;
    if (MVar2 != Impute) {
      missing_action_00 = MVar2;
    }
    if (MVar2 == Impute && uVar13 != 0) {
      uVar3 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar5[uVar3])) {
          uVar3 = uVar13 * 4 & 0xfffffffffffffff8;
          lVar12 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit<double,unsigned_long,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,double*,unsigned_long*,unsigned_long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>>
                    (__first,(unsigned_long *)((long)__first + uVar3),__first + uVar13,
                     (ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3440:30)>
                      )&buffer_arr);
          auVar1 = _DAT_0036e1f0;
          dVar15 = buffer_arr[*(long *)((long)__first + uVar3)];
          *saved_xmedian = dVar15;
          pdVar5 = buffer_arr;
          uVar8 = uVar13;
          if ((end_00 & 1) != 0) {
            puVar9 = __first;
            if (uVar3 != 8) {
              uVar7 = *__first;
              lVar12 = uVar3 - 8;
              puVar4 = __first;
              do {
                puVar4 = puVar4 + 1;
                uVar3 = *puVar4;
                bVar14 = uVar7 < uVar3;
                if (uVar7 <= uVar3) {
                  uVar7 = uVar3;
                }
                if (bVar14) {
                  puVar9 = puVar4;
                }
                lVar12 = lVar12 + -8;
              } while (lVar12 != 0);
            }
            dVar16 = ((double)CONCAT44(0x45300000,(int)(*puVar9 >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)*puVar9) - 4503599627370496.0);
            *saved_xmedian = (dVar15 - dVar16) * 0.5 + dVar16;
          }
          do {
            pdVar10 = saved_xmedian;
            if ((ulong)ABS(*pdVar5) < 0x7ff0000000000000) {
              pdVar10 = pdVar5;
            }
            *pdVar5 = *pdVar10;
            uVar8 = uVar8 - 1;
            pdVar5 = pdVar5 + 1;
          } while (uVar8 != 0);
          sVar6 = 0;
          auVar17 = _DAT_0036e1e0;
          do {
            auVar18 = auVar17 ^ auVar1;
            if ((bool)(~(auVar18._4_4_ == iVar20 && auVar19._0_4_ < auVar18._0_4_ ||
                        iVar20 < auVar18._4_4_) & 1)) {
              __first[sVar6] = sVar6;
            }
            if ((auVar18._12_4_ != iVar21 || auVar18._8_4_ <= auVar19._8_4_) &&
                auVar18._12_4_ <= iVar21) {
              __first[sVar6 + 1] = sVar6 + 1;
            }
            sVar6 = sVar6 + 2;
            lVar12 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 2;
            auVar17._8_8_ = lVar12 + 2;
            pdVar10 = saved_xmedian;
            pdVar5 = buffer_arr;
            missing_action_00 = Fail;
          } while ((uVar11 - ((uint)end_00 & 1)) + 2 != sVar6);
          goto LAB_0023ce3e;
        }
        uVar3 = uVar3 + 1;
      } while (uVar13 != uVar3);
      pdVar10 = saved_xmedian;
      missing_action_00 = Fail;
    }
  }
LAB_0023ce3e:
  dVar15 = eval_guided_crit<double,long_double>
                     (__first,0,end_00,pdVar5,pdVar5 + uVar13,as_relative_gain,pdVar10,(double *)0x0
                      ,&ignored,split_point,xmin,xmax,criterion,min_gain,missing_action_00,cols_use,
                      ncols_use,force_cols_use,X_row_major,ncols,Xr,Xr_ind,Xr_indptr);
  return dVar15;
}

Assistant:

double eval_guided_crit(size_t ix_arr[], size_t st, size_t end,
                        size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                        double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                        double *restrict saved_xmedian,
                        double &split_point, double &xmin, double &xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);

    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }

    no_nas:
    return eval_guided_crit<double, ldouble_safe>(
                            buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                            as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                            xmin, xmax, criterion, min_gain, missing_action,
                            cols_use, ncols_use, force_cols_use,
                            X_row_major, ncols,
                            Xr, Xr_ind, Xr_indptr);
}